

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableStringFieldGenerator::GenerateMergingCode
          (RepeatedImmutableStringFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "if (!other.$name$_.isEmpty()) {\n  if ($name$_.isEmpty()) {\n    $name$_ = other.$name$_;\n    $clear_mutable_bit_builder$;\n  } else {\n    ensure$capitalized_name$IsMutable();\n    $name$_.addAll(other.$name$_);\n  }\n  $on_changed$\n}\n"
                    );
  return;
}

Assistant:

void RepeatedImmutableStringFieldGenerator::GenerateMergingCode(
    io::Printer* printer) const {
  // The code below does two optimizations:
  //   1. If the other list is empty, there's nothing to do. This ensures we
  //      don't allocate a new array if we already have an immutable one.
  //   2. If the other list is non-empty and our current list is empty, we can
  //      reuse the other list which is guaranteed to be immutable.
  printer->Print(variables_,
                 "if (!other.$name$_.isEmpty()) {\n"
                 "  if ($name$_.isEmpty()) {\n"
                 "    $name$_ = other.$name$_;\n"
                 "    $clear_mutable_bit_builder$;\n"
                 "  } else {\n"
                 "    ensure$capitalized_name$IsMutable();\n"
                 "    $name$_.addAll(other.$name$_);\n"
                 "  }\n"
                 "  $on_changed$\n"
                 "}\n");
}